

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.cpp
# Opt level: O0

void __thiscall Sexp::TracePointers(Sexp *this,function<void_(Sexp_**)> *func)

{
  Activation *pAVar1;
  function<void_(Sexp_**)> local_88;
  function<void_(Sexp_**)> local_68;
  function<void_(Sexp_**)> local_38;
  function<void_(Sexp_**)> *local_18;
  function<void_(Sexp_**)> *func_local;
  Sexp *this_local;
  
  local_18 = func;
  func_local = (function<void_(Sexp_**)> *)this;
  switch(this->kind) {
  case CONS:
    std::function<void_(Sexp_**)>::operator()(func,(Sexp **)&(this->field_1).port_value);
    std::function<void_(Sexp_**)>::operator()(func,&(this->field_1).cons.cdr);
    break;
  case ACTIVATION:
    pAVar1 = (this->field_1).activation;
    std::function<void_(Sexp_**)>::function(&local_68,func);
    Activation::TracePointers(pAVar1,&local_68);
    std::function<void_(Sexp_**)>::~function(&local_68);
    break;
  case FUNCTION:
  case MACRO:
    pAVar1 = (this->field_1).activation;
    std::function<void_(Sexp_**)>::function(&local_38,func);
    (**(code **)(pAVar1->parent + 1))(pAVar1,&local_38);
    std::function<void_(Sexp_**)>::~function(&local_38);
    std::function<void_(Sexp_**)>::operator()(func,&(this->field_1).cons.cdr);
    break;
  case MEANING:
    pAVar1 = (this->field_1).activation;
    std::function<void_(Sexp_**)>::function(&local_88,func);
    (**(code **)(pAVar1->parent + 1))(pAVar1,&local_88);
    std::function<void_(Sexp_**)>::~function(&local_88);
  default:
  }
  return;
}

Assistant:

void Sexp::TracePointers(std::function<void(Sexp **)> func) {
  switch (kind) {
  case Sexp::Kind::CONS:
    func(&this->cons.car);
    func(&this->cons.cdr);
    break;
  case Sexp::Kind::MACRO:
  case Sexp::Kind::FUNCTION:
    this->function.func_meaning->TracePointers(func);
    func(&this->function.activation);
    break;
  case Sexp::Kind::ACTIVATION:
    this->activation->TracePointers(func);
    break;
  case Sexp::Kind::MEANING:
    this->meaning->TracePointers(func);
  default:
    break;
  }
}